

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O1

void __thiscall Assimp::IFC::Curve::SampleDiscrete(Curve *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  pointer *ppaVar1;
  iterator __position;
  int iVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  undefined1 auVar6 [16];
  IfcFloat IVar7;
  aiVector3t<double> local_40;
  undefined4 extraout_var;
  
  IVar7 = b;
  (*this->_vptr_Curve[5])();
  iVar2 = (*this->_vptr_Curve[2])(this);
  if (((char)iVar2 == '\0') &&
     ((a - extraout_XMM0_Qa <= -1.1920928955078125e-07 || (IVar7 - a <= -1.1920928955078125e-07))))
  {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x24b,
                  "virtual void Assimp::IFC::Curve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  IVar7 = a;
  (*this->_vptr_Curve[5])(this);
  iVar2 = (*this->_vptr_Curve[2])(this);
  if (((char)iVar2 == '\0') &&
     ((b - extraout_XMM0_Qa_00 <= -1.1920928955078125e-07 || (IVar7 - b <= -1.1920928955078125e-07))
     )) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x24c,
                  "virtual void Assimp::IFC::Curve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  iVar2 = (*this->_vptr_Curve[6])(a,b,this);
  uVar3 = CONCAT44(extraout_var,iVar2);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&out->mVerts,
             uVar3 + ((long)(out->mVerts).
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(out->mVerts).
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
             1);
  dVar5 = b - a;
  auVar6._8_4_ = extraout_var;
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = 0x45300000;
  uVar4 = 0;
  do {
    (*this->_vptr_Curve[3])(a,&local_40,this);
    __position._M_current =
         (out->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (out->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)out,__position,
                 &local_40);
    }
    else {
      (__position._M_current)->z = local_40.z;
      (__position._M_current)->x = local_40.x;
      (__position._M_current)->y = local_40.y;
      ppaVar1 = &(out->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    uVar4 = uVar4 + 1;
    a = a + dVar5 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0));
  } while (uVar4 <= uVar3);
  return;
}

Assistant:

void Curve::SampleDiscrete(TempMesh& out,IfcFloat a, IfcFloat b) const {
    ai_assert( InRange( a ) );
    ai_assert( InRange( b ) );

    const size_t cnt = std::max(static_cast<size_t>(0),EstimateSampleCount(a,b));
    out.mVerts.reserve( out.mVerts.size() + cnt + 1);

    IfcFloat p = a, delta = (b-a)/cnt;
    for(size_t i = 0; i <= cnt; ++i, p += delta) {
        out.mVerts.push_back(Eval(p));
    }
}